

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256_tests.cpp
# Opt level: O1

string * __thiscall
arith_uint256_tests::ArrayToString_abi_cxx11_
          (string *__return_storage_ptr__,arith_uint256_tests *this,uchar *A,uint width)

{
  long lVar1;
  char cVar2;
  long lVar3;
  long in_FS_OFFSET;
  stringstream Stream;
  stringstream asStack_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
  lVar3 = 0x20;
  do {
    *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
    lVar1 = *(long *)(local_1a8[0] + -0x18);
    if (acStack_c8[lVar1 + 1] == '\0') {
      cVar2 = std::ios::widen((char)local_1a8 + (char)lVar1);
      acStack_c8[lVar1] = cVar2;
      acStack_c8[lVar1 + 1] = '\x01';
    }
    acStack_c8[lVar1] = '0';
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base(local_138);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::string ArrayToString(const unsigned char A[], unsigned int width)
{
    std::stringstream Stream;
    Stream << std::hex;
    for (unsigned int i = 0; i < width; ++i)
    {
        Stream<<std::setw(2)<<std::setfill('0')<<(unsigned int)A[width-i-1];
    }
    return Stream.str();
}